

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,ArrayPtr<const_char> *first,CappedArray<char,_14UL> *rest,
                 FixedArray<char,_1UL> *rest_1,CappedArray<char,_14UL> *rest_2,
                 FixedArray<char,_1UL> *rest_3,ArrayPtr<const_char> *rest_4,
                 ArrayPtr<const_char> *rest_5)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = first->ptr;
  sVar1 = first->size_;
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    target[sVar3] = pcVar2[sVar3];
  }
  pcVar2 = fill<kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                     (target + sVar3,rest,rest_1,rest_2,rest_3,rest_4,rest_5);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}